

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VWrmsNormMaskVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  timespec spec;
  int local_74;
  double local_70;
  double local_58;
  double dStack_50;
  double local_48;
  timespec local_40;
  
  lVar4 = N_VGetLength();
  dVar8 = (double)(lVar4 + -1) / (double)lVar4;
  local_70 = 0.0;
  if (0.0 < dVar8) {
    if (dVar8 < 0.0) {
      local_70 = sqrt(dVar8);
    }
    else {
      local_70 = SQRT(dVar8);
    }
  }
  puVar5 = (undefined8 *)N_VCloneVectorArray(3,X);
  puVar6 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0,*puVar5);
  N_VConst(0,*puVar6);
  N_VConst(0,X);
  if (myid == 0) {
    set_element(X,param_2 + -1,0.0);
  }
  local_58 = -1.0;
  dStack_50 = -1.0;
  local_48 = -1.0;
  local_74 = 1;
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_40.tv_nsec;
  iVar1 = N_VWrmsNormMaskVectorArray(1,puVar5,puVar6,X,&local_58);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar7 = local_40.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_40.tv_nsec;
  if (((iVar1 != 0) || (local_58 < 0.0)) ||
     (iVar1 = SUNRCompare(SUB84(local_58,0),local_70 * 0.5 * 0.5), iVar1 != 0)) {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",(ulong)(uint)myid);
  }
  else {
    local_74 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 ");
    }
  }
  dVar8 = max_time(X,(dVar9 / 1000000000.0 + (double)lVar7) - (dVar8 / 1000000000.0 + (double)lVar4)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VWrmsNormVectorArray");
  }
  N_VConst(0,*puVar5);
  N_VConst(0,puVar5[1]);
  N_VConst(0,puVar5[2]);
  N_VConst(0,*puVar6);
  N_VConst(0,puVar6[1]);
  N_VConst(0,puVar6[2]);
  N_VConst(0,X);
  if (myid == 0) {
    set_element(X,param_2 + -1,0.0);
  }
  local_58 = -1.0;
  dStack_50 = -1.0;
  local_48 = -1.0;
  iVar2 = 1;
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_40.tv_nsec;
  iVar1 = N_VWrmsNormMaskVectorArray(3,puVar5,puVar6,X,&local_58);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar7 = local_40.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    if (0.0 <= local_58) {
      iVar2 = SUNRCompare();
    }
    iVar3 = 1;
    iVar1 = 1;
    if (0.0 <= dStack_50) {
      iVar1 = SUNRCompare();
    }
    if (0.0 <= local_48) {
      iVar3 = SUNRCompare(SUB84(local_48,0),local_70 * 0.5);
    }
    if (iVar1 + iVar2 + iVar3 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 ");
      }
      goto LAB_0010be8e;
    }
  }
  printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",(ulong)(uint)myid);
  local_74 = local_74 + 1;
LAB_0010be8e:
  dVar8 = max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar7) -
                     (dVar8 / 1000000000.0 + (double)lVar4));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VWrmsNormVectorArray");
  }
  N_VDestroyVectorArray(puVar5,3);
  N_VDestroyVectorArray(puVar6,3);
  return local_74;
}

Assistant:

int Test_N_VWrmsNormMaskVectorArray(N_Vector X, sunindextype local_length,
                                    int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;

  sunrealtype fac;
  sunrealtype nrm[3];
  N_Vector* Z;
  N_Vector* W;

  /* get global length */
  global_length = N_VGetLength(X);

  /* factor used in checking solutions */
  fac = SUNRsqrt((sunrealtype)(global_length - 1) / (global_length));

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  W = N_VCloneVectorArray(3, X);

  /*
   * Case 1: nrm[0] = ||Z[0]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(HALF, W[0]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(1, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* nrm should equal fac/4 */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /*
   * Case 2: nrm[i] = ||Z[i]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(TWO * TWO, Z[1]);
  N_VConst(HALF, Z[2]);

  N_VConst(HALF, W[0]);
  N_VConst(HALF * HALF, W[1]);
  N_VConst(ONE, W[2]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(3, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal fac/4, fac, fac/2] */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
    failure += (nrm[1] < ZERO) ? 1 : SUNRCompare(nrm[1], fac);
    failure += (nrm[2] < ZERO) ? 1 : SUNRCompare(nrm[2], fac * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(W, 3);

  return (fails);
}